

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_underlying_type_test_generated.h
# Opt level: O2

Offset<UnionUnderlyingType::D>
UnionUnderlyingType::CreateD(FlatBufferBuilder *_fbb,DT *_o,rehasher_function_t *_rehasher)

{
  ABC test_union_type;
  Offset<void> test_union;
  Offset<flatbuffers::Vector<UnionUnderlyingType::ABC,_unsigned_int>_> test_vector_of_union_type;
  Offset<flatbuffers::Vector<flatbuffers::Offset<void>,_unsigned_int>_> test_vector_of_union;
  Offset<UnionUnderlyingType::D> OVar1;
  long lVar2;
  _VectorArgs _va;
  FlatBufferBuilder *local_48;
  DT *local_40;
  rehasher_function_t *local_38;
  
  test_union_type = (_o->test_union).type;
  test_vector_of_union.o = 0;
  local_48 = _fbb;
  local_40 = _o;
  local_38 = _rehasher;
  test_union = ABCUnion::Pack(&_o->test_union,_fbb,(rehasher_function_t *)0x0);
  lVar2 = (long)(_o->test_vector_of_union).
                super__Vector_base<UnionUnderlyingType::ABCUnion,_std::allocator<UnionUnderlyingType::ABCUnion>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(_o->test_vector_of_union).
                super__Vector_base<UnionUnderlyingType::ABCUnion,_std::allocator<UnionUnderlyingType::ABCUnion>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar2 == 0) {
    test_vector_of_union_type.o = 0;
  }
  else {
    test_vector_of_union_type =
         flatbuffers::FlatBufferBuilderImpl<false>::
         CreateVector<UnionUnderlyingType::ABC,UnionUnderlyingType::CreateD(flatbuffers::FlatBufferBuilderImpl<false>&,UnionUnderlyingType::DT_const*,std::function<unsigned_long(void*)>const*)::_lambda(unsigned_long,UnionUnderlyingType::CreateD(flatbuffers::FlatBufferBuilderImpl<false>&,UnionUnderlyingType::DT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs*)_1_,UnionUnderlyingType::CreateD(flatbuffers::FlatBufferBuilderImpl<false>&,UnionUnderlyingType::DT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs>
                   (_fbb,lVar2 >> 4,&local_48);
    lVar2 = (long)(_o->test_vector_of_union).
                  super__Vector_base<UnionUnderlyingType::ABCUnion,_std::allocator<UnionUnderlyingType::ABCUnion>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(_o->test_vector_of_union).
                  super__Vector_base<UnionUnderlyingType::ABCUnion,_std::allocator<UnionUnderlyingType::ABCUnion>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    test_vector_of_union.o = 0;
    if (lVar2 != 0) {
      test_vector_of_union =
           flatbuffers::FlatBufferBuilderImpl<false>::
           CreateVector<flatbuffers::Offset<void>,UnionUnderlyingType::CreateD(flatbuffers::FlatBufferBuilderImpl<false>&,UnionUnderlyingType::DT_const*,std::function<unsigned_long(void*)>const*)::_lambda(unsigned_long,UnionUnderlyingType::CreateD(flatbuffers::FlatBufferBuilderImpl<false>&,UnionUnderlyingType::DT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs*)_2_,UnionUnderlyingType::CreateD(flatbuffers::FlatBufferBuilderImpl<false>&,UnionUnderlyingType::DT_const*,std::function<unsigned_long(void*)>const*)::_VectorArgs>
                     (_fbb,lVar2 >> 4,&local_48);
    }
  }
  OVar1 = CreateD(_fbb,test_union_type,test_union,test_vector_of_union_type,test_vector_of_union);
  return (Offset<UnionUnderlyingType::D>)OVar1.o;
}

Assistant:

inline ::flatbuffers::Offset<D> CreateD(::flatbuffers::FlatBufferBuilder &_fbb, const DT *_o, const ::flatbuffers::rehasher_function_t *_rehasher) {
  (void)_rehasher;
  (void)_o;
  struct _VectorArgs { ::flatbuffers::FlatBufferBuilder *__fbb; const DT* __o; const ::flatbuffers::rehasher_function_t *__rehasher; } _va = { &_fbb, _o, _rehasher}; (void)_va;
  auto _test_union_type = _o->test_union.type;
  auto _test_union = _o->test_union.Pack(_fbb);
  auto _test_vector_of_union_type = _o->test_vector_of_union.size() ? _fbb.CreateVector<ABC>(_o->test_vector_of_union.size(), [](size_t i, _VectorArgs *__va) { return __va->__o->test_vector_of_union[i].type; }, &_va) : 0;
  auto _test_vector_of_union = _o->test_vector_of_union.size() ? _fbb.CreateVector<::flatbuffers::Offset<void>>(_o->test_vector_of_union.size(), [](size_t i, _VectorArgs *__va) { return __va->__o->test_vector_of_union[i].Pack(*__va->__fbb, __va->__rehasher); }, &_va) : 0;
  return UnionUnderlyingType::CreateD(
      _fbb,
      _test_union_type,
      _test_union,
      _test_vector_of_union_type,
      _test_vector_of_union);
}